

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromScene
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  char *pcVar8;
  byte in_CL;
  byte in_DL;
  float *in_RDI;
  Float FVar9;
  double dVar10;
  Ray *this_00;
  undefined8 uVar19;
  undefined1 auVar20 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  Point3f PVar21;
  Vector3<float> VVar22;
  Point3f PVar23;
  Float ta;
  Float eta_t;
  Float eta_i;
  Vector3f wt;
  Float apertureRadius2;
  Float r2;
  Point3f pHit;
  float vb;
  Float va;
  Float zCenter;
  Float radius;
  Normal3f n;
  Float t;
  bool isStop;
  LensElementInterface *element;
  size_t i;
  Ray ray;
  Float elementZ;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffda0;
  RealisticCamera *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdd8;
  Ray *in_stack_fffffffffffffde0;
  char (*in_stack_fffffffffffffde8) [4];
  char (*in_stack_fffffffffffffdf0) [2];
  char *in_stack_fffffffffffffdf8;
  undefined4 uStack_200;
  int in_stack_fffffffffffffe04;
  Float in_stack_fffffffffffffe08;
  Float in_stack_fffffffffffffe0c;
  double in_stack_fffffffffffffe10;
  LogLevel level;
  char (*in_stack_fffffffffffffe20) [2];
  float *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  Float in_stack_fffffffffffffe5c;
  Normal3f *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  Ray *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  float local_16c;
  Normal3f *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Ray *in_stack_fffffffffffffeb0;
  Float in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  float local_f4;
  uint local_d4;
  float fStack_d0;
  float local_b8;
  float local_70;
  char *local_60;
  undefined8 local_58;
  float local_50;
  float local_44;
  float local_20;
  byte local_1a;
  byte local_19;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  FVar9 = LensFrontZ(in_stack_fffffffffffffdc0);
  local_20 = FVar9 * -1.0;
  if ((DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar4 = __cxa_guard_acquire(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera)
     , iVar4 != 0)) {
    Scale((Float)((ulong)in_stack_fffffffffffffe70 >> 0x20),(Float)in_stack_fffffffffffffe70,
          in_stack_fffffffffffffe6c);
    __cxa_guard_release(&DrawRayPathFromScene(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  Transform::operator()
            ((Transform *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             in_stack_fffffffffffffe80,
             (Float *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_60 = (char *)0x0;
  do {
    level = (LogLevel)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    pcVar8 = local_60;
    pcVar5 = (char *)pstd::
                     vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                     ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(in_RDI + 0xe4));
    FVar9 = (Float)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
    if (pcVar5 <= pcVar8) {
      if ((local_1a & 1) != 0) {
        auVar20 = (undefined1  [56])0x0;
        PVar21 = Ray::operator()(in_stack_fffffffffffffde0,FVar9);
        auVar16._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar16._8_56_ = auVar20;
        vmovlpd_avx(auVar16._0_16_);
        dVar10 = (double)PVar21.super_Tuple3<pbrt::Point3,_float>.z;
        uVar19 = 0;
        PVar21 = Ray::operator()(in_stack_fffffffffffffde0,FVar9);
        uStack_200 = (undefined4)uVar19;
        auVar1._8_4_ = uStack_200;
        auVar1._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar1._12_4_ = (int)((ulong)uVar19 >> 0x20);
        uVar19 = vmovlpd_avx(auVar1);
        local_16c = (float)uVar19;
        printf("Point[{%f, %f}], ",dVar10,(double)local_16c);
      }
      pcVar8 = "Line";
      if ((local_19 & 1) != 0) {
        pcVar8 = "Arrow";
      }
      dVar10 = (double)local_50;
      this_00 = (Ray *)(double)(float)local_58;
      auVar20 = (undefined1  [56])0x0;
      PVar21 = Ray::operator()(this_00,(Float)((ulong)dVar10 >> 0x20));
      auVar17._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar17._8_56_ = auVar20;
      vmovlpd_avx(auVar17._0_16_);
      auVar20 = (undefined1  [56])0x0;
      PVar23 = Ray::operator()(this_00,(Float)((ulong)dVar10 >> 0x20));
      auVar18._0_8_ = PVar23.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar18._8_56_ = auVar20;
      uVar19 = vmovlpd_avx(auVar18._0_16_);
      printf("%s[{{%f, %f}, {%f, %f}}]",dVar10,this_00,
             (double)PVar21.super_Tuple3<pbrt::Point3,_float>.z,(double)(float)uVar19,pcVar8);
      return;
    }
    pvVar6 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                           *)(in_RDI + 0xe4),(size_type)local_60);
    bVar3 = pvVar6->curvatureRadius != 0.0;
    Normal3<float>::Normal3((Normal3<float> *)0x6bcb2b);
    if (bVar3) {
      bVar2 = IntersectSphericalElement
                        ((Float)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_fffffffffffffeb0,
                         (Float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         in_stack_fffffffffffffea0);
      if (!bVar2) {
        return;
      }
    }
    else {
      local_70 = -(local_50 - local_20) / local_44;
    }
    if (local_70 < 0.0) {
      LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],float&,char_const(&)[4],float&>
                (level,(char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffde8,in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,
                 (char (*) [4])pcVar8,in_RDI);
    }
    dVar10 = (double)local_50;
    in_stack_fffffffffffffe20 = (char (*) [2])(double)(float)local_58;
    auVar20 = (undefined1  [56])0x0;
    in_stack_fffffffffffffe28 = (float *)&local_58;
    PVar21 = Ray::operator()(in_stack_fffffffffffffde0,
                             (Float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    auVar11._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar11._8_56_ = auVar20;
    vmovlpd_avx(auVar11._0_16_);
    in_stack_fffffffffffffe10 = (double)PVar21.super_Tuple3<pbrt::Point3,_float>.z;
    auVar20 = (undefined1  [56])0x0;
    PVar21 = Ray::operator()(in_stack_fffffffffffffde0,
                             (Float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    auVar12._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar20;
    uVar19 = vmovlpd_avx(auVar12._0_16_);
    local_b8 = (float)uVar19;
    printf("Line[{{%f, %f}, {%f, %f}}],",dVar10,in_stack_fffffffffffffe20,in_stack_fffffffffffffe10,
           (double)local_b8);
    auVar20 = (undefined1  [56])0x0;
    PVar21 = Ray::operator()(in_stack_fffffffffffffde0,
                             (Float)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
    local_50 = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar20;
    local_58 = vmovlpd_avx(auVar13._0_16_);
    local_d4 = (uint)local_58;
    fStack_d0 = (float)((ulong)local_58 >> 0x20);
    auVar1 = vfmadd213ss_fma(ZEXT416(local_d4),ZEXT416(local_d4),
                             ZEXT416((uint)(fStack_d0 * fStack_d0)));
    if (pvVar6->apertureRadius * pvVar6->apertureRadius < auVar1._0_4_) {
      return;
    }
    if (bVar3) {
      Vector3<float>::Vector3((Vector3<float> *)0x6bce83);
      if (local_60 == (char *)0x0) {
LAB_006bcebf:
        in_stack_fffffffffffffe0c = 1.0;
      }
      else {
        pvVar7 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0xe4),(size_type)(local_60 + -1));
        if ((pvVar7->eta == 0.0) && (!NAN(pvVar7->eta))) goto LAB_006bcebf;
        pvVar7 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0xe4),(size_type)(local_60 + -1));
        in_stack_fffffffffffffe0c = pvVar7->eta;
      }
      pvVar7 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(in_RDI + 0xe4),(size_type)local_60);
      if ((pvVar7->eta != 0.0) || (NAN(pvVar7->eta))) {
        pvVar7 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0xe4),(size_type)local_60);
        in_stack_fffffffffffffe08 = pvVar7->eta;
      }
      else {
        in_stack_fffffffffffffe08 = 1.0;
      }
      auVar20 = (undefined1  [56])0x0;
      VVar22 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffda0);
      auVar14._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar20;
      vmovlpd_avx(auVar14._0_16_);
      VVar22 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffffdc0);
      auVar15._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar20;
      in_stack_fffffffffffffec0 = vmovlpd_avx(auVar15._0_16_);
      bVar3 = Refract((Vector3f *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                      (Vector3f *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        return;
      }
      local_44 = local_f4;
    }
    local_20 = pvVar6->thickness + local_20;
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void RealisticCamera::DrawRayPathFromScene(const Ray &r, bool arrow,
                                           bool toOpticalIntercept) const {
    Float elementZ = LensFrontZ() * -1;

    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                return;
        }
        CHECK_GE(t, 0.f);

        printf("Line[{{%f, %f}, {%f, %f}}],", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            return;
        ray.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0.f)
                              ? 1.f
                              : elementInterfaces[i - 1].eta;
            Float eta_t =
                (elementInterfaces[i].eta != 0.f) ? elementInterfaces[i].eta : 1.f;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                return;
            ray.d = wt;
        }
        elementZ += element.thickness;
    }

    // go to the film plane by default
    {
        Float ta = -ray.o.z / ray.d.z;
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf("Point[{%f, %f}], ", ray(ta).z, ray(ta).x);
        }
        printf("%s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);
    }
}